

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::TexturePool::~TexturePool(TexturePool *this)

{
  glDeleteTextures((ulong)((long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

~TexturePool()
        {
            glDeleteTextures(size(), data());
        }